

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

float tcu::refract(float i,float n,float eta)

{
  float fVar1;
  float fVar2;
  
  fVar2 = i * n;
  fVar1 = 1.0 - eta * eta * (1.0 - fVar2 * fVar2);
  if (fVar1 < 0.0) {
    return 0.0;
  }
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  return i * eta - (fVar2 * eta + fVar1) * n;
}

Assistant:

inline float refract		(float i, float n, float eta)
{
	float cosAngle = (n * i);
	float k = 1.0f - eta * eta * (1.0f - cosAngle * cosAngle);
	if (k < 0.0f)
		return 0.0f;
	else
		return eta * i - (eta * cosAngle + deFloatSqrt(k)) * n;
}